

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O0

FT_Error cff_index_access_element
                   (CFF_Index idx,FT_UInt element,FT_Byte **pbytes,FT_ULong *pbyte_len)

{
  FT_Stream stream_00;
  bool bVar1;
  FT_ULong pos;
  FT_ULong off2;
  FT_ULong off1;
  FT_Stream stream;
  FT_ULong *pFStack_28;
  FT_Error error;
  FT_ULong *pbyte_len_local;
  FT_Byte **pbytes_local;
  CFF_Index pCStack_10;
  FT_UInt element_local;
  CFF_Index idx_local;
  
  stream._4_4_ = 0;
  if ((idx == (CFF_Index)0x0) || (idx->count <= element)) {
    stream._4_4_ = 6;
  }
  else {
    stream_00 = idx->stream;
    pos = 0;
    pFStack_28 = pbyte_len;
    pbyte_len_local = (FT_ULong *)pbytes;
    pbytes_local._4_4_ = element;
    pCStack_10 = idx;
    if (idx->offsets == (FT_ULong *)0x0) {
      stream._4_4_ = FT_Stream_Seek(stream_00,
                                    idx->start + (ulong)idx->hdr_size +
                                    (ulong)(element * idx->off_size));
      if (stream._4_4_ != 0) {
        return stream._4_4_;
      }
      off2 = cff_index_read_offset(pCStack_10,(FT_Error *)((long)&stream + 4));
      if (stream._4_4_ != 0) {
        return stream._4_4_;
      }
      if (off2 != 0) {
        do {
          pbytes_local._4_4_ = pbytes_local._4_4_ + 1;
          pos = cff_index_read_offset(pCStack_10,(FT_Error *)((long)&stream + 4));
          bVar1 = false;
          if (pos == 0) {
            bVar1 = pbytes_local._4_4_ < pCStack_10->count;
          }
        } while (bVar1);
      }
    }
    else {
      off2 = idx->offsets[element];
      if (off2 != 0) {
        do {
          pbytes_local._4_4_ = pbytes_local._4_4_ + 1;
          pos = idx->offsets[pbytes_local._4_4_];
          bVar1 = false;
          if (pos == 0) {
            bVar1 = pbytes_local._4_4_ < idx->count;
          }
        } while (bVar1);
      }
    }
    if ((stream_00->size + 1 < pos) || ((stream_00->size - pos) + 1 < pCStack_10->data_offset)) {
      pos = (stream_00->size - pCStack_10->data_offset) + 1;
    }
    if ((off2 == 0) || (pos <= off2)) {
      *pbyte_len_local = 0;
      *pFStack_28 = 0;
    }
    else {
      *pFStack_28 = pos - off2;
      if (pCStack_10->bytes == (FT_Byte *)0x0) {
        stream._4_4_ = FT_Stream_Seek(stream_00,(pCStack_10->data_offset + off2) - 1);
        if (stream._4_4_ == 0) {
          stream._4_4_ = FT_Stream_ExtractFrame(stream_00,pos - off2,(FT_Byte **)pbyte_len_local);
        }
      }
      else {
        *pbyte_len_local = (FT_ULong)(pCStack_10->bytes + (off2 - 1));
      }
    }
  }
  return stream._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_index_access_element( CFF_Index  idx,
                            FT_UInt    element,
                            FT_Byte**  pbytes,
                            FT_ULong*  pbyte_len )
  {
    FT_Error  error = FT_Err_Ok;


    if ( idx && idx->count > element )
    {
      /* compute start and end offsets */
      FT_Stream  stream = idx->stream;
      FT_ULong   off1, off2 = 0;


      /* load offsets from file or the offset table */
      if ( !idx->offsets )
      {
        FT_ULong  pos = element * idx->off_size;


        if ( FT_STREAM_SEEK( idx->start + idx->hdr_size + pos ) )
          goto Exit;

        off1 = cff_index_read_offset( idx, &error );
        if ( error )
          goto Exit;

        if ( off1 != 0 )
        {
          do
          {
            element++;
            off2 = cff_index_read_offset( idx, &error );

          } while ( off2 == 0 && element < idx->count );
        }
      }
      else   /* use offsets table */
      {
        off1 = idx->offsets[element];
        if ( off1 )
        {
          do
          {
            element++;
            off2 = idx->offsets[element];

          } while ( off2 == 0 && element < idx->count );
        }
      }

      /* XXX: should check off2 does not exceed the end of this entry; */
      /*      at present, only truncate off2 at the end of this stream */
      if ( off2 > stream->size + 1                    ||
           idx->data_offset > stream->size - off2 + 1 )
      {
        FT_ERROR(( "cff_index_access_element:"
                   " offset to next entry (%ld)"
                   " exceeds the end of stream (%ld)\n",
                   off2, stream->size - idx->data_offset + 1 ));
        off2 = stream->size - idx->data_offset + 1;
      }

      /* access element */
      if ( off1 && off2 > off1 )
      {
        *pbyte_len = off2 - off1;

        if ( idx->bytes )
        {
          /* this index was completely loaded in memory, that's easy */
          *pbytes = idx->bytes + off1 - 1;
        }
        else
        {
          /* this index is still on disk/file, access it through a frame */
          if ( FT_STREAM_SEEK( idx->data_offset + off1 - 1 ) ||
               FT_FRAME_EXTRACT( off2 - off1, *pbytes )      )
            goto Exit;
        }
      }
      else
      {
        /* empty index element */
        *pbytes    = 0;
        *pbyte_len = 0;
      }
    }
    else
      error = FT_THROW( Invalid_Argument );

  Exit:
    return error;
  }